

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

void SEM_IF(ast *node)

{
  ast *node_00;
  ast *paVar1;
  ast *in_RDI;
  ast *sibling6;
  attr *expr_type;
  ast *in_stack_00000058;
  
  sibling(in_RDI,2);
  node_00 = (ast *)SEM_Exp(in_stack_00000058);
  if (node_00 != (ast *)0x0) {
    for (; node_00->type == 1;
        node_00 = (ast *)((anon_union_8_4_35def4f3_for_attr_1 *)&node_00->name)->array->type) {
    }
    if (node_00->type == 3) {
      node_00 = (ast *)((anon_union_8_4_35def4f3_for_attr_1 *)&node_00->name)->function->return_type
      ;
    }
    if ((node_00->type != 0) ||
       (((anon_union_8_4_35def4f3_for_attr_1 *)&node_00->name)->basic->type != 2)) {
      semerror(0xc,(int)(ulong)(uint)in_RDI->pos->first_line,semErrorMsg[0xc],"#IF/WHILE CONDITION#"
              );
    }
    sibling(in_RDI,4);
    SEM_Stmt(node_00);
    paVar1 = sibling(in_RDI,6);
    if (paVar1 != (ast *)0x0) {
      SEM_Stmt(node_00);
    }
  }
  return;
}

Assistant:

static void SEM_IF(struct ast *node) {
    struct attr *expr_type = SEM_Exp(sibling(node, 2));
    if (expr_type == NULL)
        return;
    while (expr_type->kind == ARRAY) {
        expr_type = expr_type->array->type;
    }
    if (expr_type->kind == FUNCTION) {
        expr_type = expr_type->function->return_type;
    }
    if (expr_type->kind != BASIC || expr_type->basic->type != INT_T) { //DONETODO: check expr_type
//        printf("error if/while condition type\n");
        SEMERROR(NotInteger, node, "#IF/WHILE CONDITION#");
    }
    SEM_Stmt(sibling(node, 4));
    struct ast *sibling6 = sibling(node, 6);
    if (sibling6)
        SEM_Stmt(sibling6);
}